

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCode.hpp
# Opt level: O1

void __thiscall
bytecode::CompiledFile::CompiledFile
          (CompiledFile *this,Function *entrypoint,
          vector<bytecode::Function,_std::allocator<bytecode::Function>_> *functions,
          vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *objects
          ,vector<long,_std::allocator<long>_> *intConstants,
          vector<double,_std::allocator<double>_> *floatConstants,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringConstants)

{
  size_t sVar1;
  
  sVar1 = entrypoint->localsCount;
  (this->entrypoint).argumentCount = entrypoint->argumentCount;
  (this->entrypoint).localsCount = sVar1;
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            (&(this->entrypoint).closures,&entrypoint->closures);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            (&(this->entrypoint).byteCode,&entrypoint->byteCode);
  (this->functions).super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->functions).super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  (this->functions).super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (functions->super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (objects->
       super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->objects).
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (objects->
       super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->objects).
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (objects->
       super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (objects->
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (objects->
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (objects->
  super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intConstants).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->intConstants).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->intConstants).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (intConstants->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->floatConstants).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->floatConstants).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->floatConstants).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (floatConstants->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stringConstants).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (stringConstants->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->stringConstants).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (stringConstants->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->stringConstants).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (stringConstants->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (stringConstants->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (stringConstants->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (stringConstants->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

explicit CompiledFile(
    Function entrypoint,
    std::vector<Function> functions,
    std::vector<ObjectConstructor> objects,
    std::vector<std::int64_t> intConstants,
    std::vector<double> floatConstants,
    std::vector<std::string> stringConstants
  ) noexcept
  : entrypoint{std::move(entrypoint)}
  , functions{std::move(functions)}
  , objects{std::move(objects)}
  , intConstants{std::move(intConstants)}
  , floatConstants{std::move(floatConstants)}
  , stringConstants{std::move(stringConstants)}
  {}